

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O1

int DisconnectHokuyox(HOKUYO *pHokuyo)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if ((HOKUYO *)addrsHokuyo[lVar2] == pHokuyo) {
      iVar1 = DisconnectHokuyo(pHokuyo);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsHokuyo[lVar2] = (void *)0x0;
      return 0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int DisconnectHokuyox(HOKUYO* pHokuyo)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsHokuyo[id] != pHokuyo)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = DisconnectHokuyo(pHokuyo);
	if (res != EXIT_SUCCESS) return res;

	addrsHokuyo[id] = NULL;

	return EXIT_SUCCESS;
}